

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

void __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
          (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this,Index nbRows,Index nbCols)

{
  bool bVar1;
  Index nbCols_local;
  Index nbRows_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_local;
  bool error_1;
  long max_index_1;
  bool error;
  long max_index;
  
  bVar1 = false;
  if ((nbCols == 1) && (bVar1 = false, -1 < nbRows)) {
    bVar1 = true;
  }
  if (bVar1) {
    if ((nbRows == 0) || (nbCols == 0)) {
      bVar1 = false;
    }
    else {
      bVar1 = 0x7fffffffffffffff / nbCols < nbRows;
    }
    if (bVar1) {
      internal::throw_std_bad_alloc();
    }
    if ((nbRows == 0) || (nbCols == 0)) {
      bVar1 = false;
    }
    else {
      bVar1 = 0x7fffffffffffffff / nbCols < nbRows;
    }
    if (bVar1) {
      internal::throw_std_bad_alloc();
    }
    DenseStorage<double,_-1,_-1,_1,_0>::resize(&this->m_storage,nbRows * nbCols,nbRows,nbCols);
    return;
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (nbRows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (nbCols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (nbRows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (nbCols<=MaxColsAtCompileTime)) && nbRows>=0 && nbCols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/preritj[P]Extended-Kalman-Filter/src/Eigen/src/Core/PlainObjectBase.h"
                ,0xf1,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
               );
}

Assistant:

EIGEN_STRONG_INLINE void resize(Index nbRows, Index nbCols)
    {
      eigen_assert(   EIGEN_IMPLIES(RowsAtCompileTime!=Dynamic,nbRows==RowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime!=Dynamic,nbCols==ColsAtCompileTime)
                   && EIGEN_IMPLIES(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic,nbRows<=MaxRowsAtCompileTime)
                   && EIGEN_IMPLIES(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic,nbCols<=MaxColsAtCompileTime)
                   && nbRows>=0 && nbCols>=0 && "Invalid sizes when resizing a matrix or array.");
      internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(nbRows, nbCols);
      #ifdef EIGEN_INITIALIZE_COEFFS
        Index size = nbRows*nbCols;
        bool size_changed = size != this->size();
        m_storage.resize(size, nbRows, nbCols);
        if(size_changed) EIGEN_INITIALIZE_COEFFS_IF_THAT_OPTION_IS_ENABLED
      #else
        internal::check_rows_cols_for_overflow<MaxSizeAtCompileTime>::run(nbRows, nbCols);
        m_storage.resize(nbRows*nbCols, nbRows, nbCols);
      #endif
    }